

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O3

int DSA_set0_key(DSA *dsa,BIGNUM *pub_key,BIGNUM *priv_key)

{
  int iVar1;
  
  iVar1 = 0;
  if (pub_key != (BIGNUM *)0x0 || (BIGNUM *)dsa->pub_key != (BIGNUM *)0x0) {
    if (pub_key != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->pub_key);
      dsa->pub_key = pub_key;
    }
    iVar1 = 1;
    if (priv_key != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->priv_key);
      dsa->priv_key = priv_key;
    }
  }
  return iVar1;
}

Assistant:

int DSA_set0_key(DSA *dsa, BIGNUM *pub_key, BIGNUM *priv_key) {
  if (dsa->pub_key == NULL && pub_key == NULL) {
    return 0;
  }

  if (pub_key != NULL) {
    BN_free(dsa->pub_key);
    dsa->pub_key = pub_key;
  }
  if (priv_key != NULL) {
    BN_free(dsa->priv_key);
    dsa->priv_key = priv_key;
  }

  return 1;
}